

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O1

size_t count_deformers(aiScene *scene)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  if ((ulong)scene->mNumMeshes != 0) {
    sVar1 = 0;
    uVar2 = 0;
    do {
      uVar3 = (ulong)scene->mMeshes[uVar2]->mNumBones;
      lVar4 = uVar3 + 1;
      if (uVar3 == 0) {
        lVar4 = 0;
      }
      sVar1 = sVar1 + lVar4;
      uVar2 = uVar2 + 1;
    } while (scene->mNumMeshes != uVar2);
    return sVar1;
  }
  return 0;
}

Assistant:

size_t count_deformers(const aiScene* scene) {
    size_t count = 0;
    for (size_t i = 0; i < scene->mNumMeshes; ++i) {
        const size_t n = scene->mMeshes[i]->mNumBones;
        if (n) {
            // 1 main deformer, 1 subdeformer per bone
            count += n + 1;
        }
    }
    return count;
}